

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

size_t bloaty::anon_unknown_0::StringViewToSize(string_view str)

{
  bool bVar1;
  int in_R8D;
  undefined4 in_register_00000084;
  string_view format;
  string_view text;
  uint64_t val;
  string local_60;
  numbers_internal *local_40;
  char *local_38;
  
  text._M_len = str._M_str;
  text._M_str = (char *)&local_40;
  bVar1 = absl::numbers_internal::safe_strtou64_base
                    ((numbers_internal *)str._M_len,text,(Nonnull<uint64_t_*>)0xa,in_R8D);
  if (bVar1) {
    return (size_t)local_40;
  }
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"couldn\'t convert string \'$0\' to integer.";
  local_40 = (numbers_internal *)str._M_len;
  local_38 = text._M_len;
  absl::Substitute_abi_cxx11_
            (&local_60,(absl *)0x28,format,(Arg *)CONCAT44(in_register_00000084,in_R8D));
  Throw(local_60._M_dataplus._M_p,0x34);
}

Assistant:

size_t StringViewToSize(string_view str) {
  size_t ret;
  if (!absl::SimpleAtoi(str, &ret)) {
    THROWF("couldn't convert string '$0' to integer.", str);
  }
  return ret;
}